

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding.cpp
# Opt level: O3

void util::from_utf8(string *from,string *to,codepage_id codepage)

{
  ulong uVar1;
  ostringstream *this;
  long lVar2;
  size_type sVar3;
  char *begin;
  ulong uVar4;
  bool bVar5;
  uint uVar6;
  size_type sVar7;
  ulong uVar8;
  byte *pbVar9;
  byte *pbVar10;
  logger local_1b0;
  
  sVar3 = from->_M_string_length;
  if (sVar3 == 0) {
    to->_M_string_length = 0;
    *(to->_M_dataplus)._M_p = '\0';
    return;
  }
  if (codepage != 0xfde9) {
    bVar5 = anon_unknown_0::is_extended_ascii(codepage);
    if (!bVar5) {
LAB_0015185a:
      if (codepage != 0x4e4) {
        if (codepage == 0x4b0) {
          begin = (from->_M_dataplus)._M_p;
          wtf8_to_utf16le(begin,begin + sVar3,to);
          return;
        }
        bVar5 = anon_unknown_0::utf8_iconv(from,to,codepage,true);
        if (bVar5) {
          return;
        }
        this = &local_1b0.buffer;
        local_1b0.level = Warning;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)this);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)this,"Unsupported output codepage: ",0x1d);
        std::ostream::_M_insert<unsigned_long>((ulong)this);
        logger::~logger(&local_1b0);
        std::__cxx11::string::_M_assign((string *)to);
        return;
      }
      to->_M_string_length = 0;
      *(to->_M_dataplus)._M_p = '\0';
      std::__cxx11::string::reserve((ulong)to);
      if (from->_M_string_length == 0) {
        return;
      }
      bVar5 = false;
      pbVar9 = (byte *)(from->_M_dataplus)._M_p;
      do {
        pbVar10 = pbVar9 + 1;
        if ((char)*pbVar9 < '\0') {
          uVar6 = 0x5f;
        }
        else {
          uVar6 = (uint)*pbVar9;
        }
        if ((0xff < uVar6 || (uVar6 & 0xe0) == 0x80) && (uVar6 != 0x20ac)) {
          uVar8 = 0;
          do {
            if (uVar8 == 0x1f) {
              bVar5 = true;
              break;
            }
            uVar4 = uVar8 & 0x3f;
            uVar1 = uVar8 + 1;
            lVar2 = uVar8 * 4;
            uVar8 = uVar1;
          } while ((uVar6 != *(uint *)((anonymous_namespace)::windows1252_replacements + lVar2 + 4))
                  || ((0x1000d001UL >> uVar4 & 1) != 0));
        }
        std::__cxx11::string::push_back((char)to);
        pbVar9 = pbVar10;
        if (pbVar10 == (byte *)((from->_M_dataplus)._M_p + from->_M_string_length)) {
          if (!bVar5) {
            return;
          }
          local_1b0.level = Warning;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1b0.buffer);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_1b0.buffer,
                     "Unsupported character while converting from UTF-8 to Windows-1252.",0x42);
          logger::~logger(&local_1b0);
          return;
        }
      } while( true );
    }
    sVar7 = 0;
    do {
      if ((from->_M_dataplus)._M_p[sVar7] < '\0') goto LAB_0015185a;
      sVar7 = sVar7 + 1;
    } while (sVar3 != sVar7);
  }
  std::__cxx11::string::_M_assign((string *)to);
  return;
}

Assistant:

void from_utf8(const std::string & from, std::string & to, codepage_id codepage) {
	
	if(from.empty()) {
		to.clear();
		return;
	}
	
	if(codepage == cp_utf8 || (is_extended_ascii(codepage) && is_ascii(from))) {
		to = from;
		return;
	}
	
	switch(codepage) {
		case cp_utf16le:     wtf8_to_utf16le(from, to); return;
		case cp_windows1252: utf8_to_windows1252(from, to); return;
		default: break;
	}
	
	#if INNOEXTRACT_HAVE_ICONV
	if(from_utf8_iconv(from, to, codepage)) {
		return;
	}
	#endif
	
	#if INNOEXTRACT_HAVE_WIN32_CONV
	if(from_utf8_win32(from, to, codepage)) {
		return;
	}
	#endif
	
	log_warning << "Unsupported output codepage: " << codepage;
	to = from;
	
}